

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O0

ImVector_ImDrawCmd * ImVector_ImDrawCmd_ImVector_ImDrawCmdVector(ImVector_ImDrawCmd *src)

{
  ImVector<ImDrawCmd> *this;
  ImVector_ImDrawCmd *src_local;
  
  ImGui::MemAlloc(0x10);
  this = (ImVector<ImDrawCmd> *)operator_new(0x10);
  ImVector<ImDrawCmd>::ImVector(this,src);
  return this;
}

Assistant:

CIMGUI_API ImVector_ImDrawCmd* ImVector_ImDrawCmd_ImVector_ImDrawCmdVector(const ImVector_ImDrawCmd src)
{
    return IM_NEW(ImVector_ImDrawCmd)(src);
}